

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O3

void aes_cbc_sw_decrypt(ssh_cipher *ciph,void *vblk,int blklen)

{
  ssh_cipheralg *psVar1;
  ssh_cipheralg *psVar2;
  ssh_cipheralg *psVar3;
  ssh_cipheralg *psVar4;
  ssh_cipheralg *psVar5;
  ssh_cipheralg *psVar6;
  ssh_cipheralg *psVar7;
  ssh_cipheralg *psVar8;
  undefined8 uVar9;
  void *pvVar10;
  uint uVar11;
  BignumInt x_1;
  ulong uVar12;
  ulong uVar13;
  byte bVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ssh_cipher *psVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ssh_cipher *psVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  BignumInt x;
  ulong uVar34;
  ulong uVar35;
  BignumInt tmp;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined4 uVar82;
  undefined4 uVar96;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  uint8_t data [64];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  ssh_cipher *local_78;
  ssh_cipher *local_70;
  ssh_cipher *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  void *local_48;
  ulong local_40;
  ulong local_38;
  
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  if (0x1e < blklen + 0xfU) {
    local_68 = ciph + -0xa2;
    uVar11 = blklen + 0xfU;
    if (-1 < blklen) {
      uVar11 = blklen;
    }
    uVar12 = (ulong)((int)uVar11 >> 4);
    local_70 = ciph + -0xb;
    local_78 = ciph;
    do {
      local_58 = 4;
      if (uVar12 < 4) {
        local_58 = uVar12;
      }
      local_60 = (ulong)(uint)((int)local_58 << 4);
      local_50 = uVar12;
      local_48 = vblk;
      memcpy(local_b8,vblk,local_60);
      pvVar10 = local_48;
      uVar12 = local_58;
      uVar27 = (((ulong)local_b8._0_8_ >> 7 ^ local_b8._0_8_) & 0xaa00aa00aa00aa) * 0x81 ^
               local_b8._0_8_;
      uVar22 = (((ulong)local_b8._8_8_ >> 7 ^ local_b8._8_8_) & 0xaa00aa00aa00aa) * 0x81 ^
               local_b8._8_8_;
      uVar27 = ((uVar27 >> 0xe ^ uVar27) & 0xcccc0000cccc) * 0x4001 ^ uVar27;
      uVar22 = ((uVar22 >> 0xe ^ uVar22) & 0xcccc0000cccc) * 0x4001 ^ uVar22;
      uVar26 = (ulong)(((uint)(uVar27 >> 0x1c) ^ (uint)uVar27) & 0xf0f0f0f0);
      uVar27 = (uVar26 << 0x1c | uVar26) ^ uVar27;
      uVar26 = (ulong)(((uint)(uVar22 >> 0x1c) ^ (uint)uVar22) & 0xf0f0f0f0);
      uVar22 = (uVar26 << 0x1c | uVar26) ^ uVar22;
      uVar26 = (uVar27 >> 8 ^ uVar22) & 0xff00ff00ff00ff;
      uVar27 = uVar26 << 8 ^ uVar27;
      uVar26 = uVar26 ^ uVar22;
      uVar28 = uVar27 & 0xffff;
      uVar34 = uVar27 >> 0x10 & 0xffff;
      uVar22 = uVar27 >> 0x20 & 0xffff;
      uVar27 = uVar27 >> 0x30;
      uVar39 = uVar26 & 0xffff;
      uVar36 = uVar26 >> 0x10 & 0xffff;
      uVar41 = uVar26 >> 0x20 & 0xffff;
      uVar26 = uVar26 >> 0x30;
      lVar16 = 0;
      do {
        uVar24 = *(ulong *)(local_a8 + lVar16);
        uVar43 = *(ulong *)(local_a8 + lVar16 + 8);
        uVar24 = ((uVar24 >> 7 ^ uVar24) & 0xaa00aa00aa00aa) * 0x81 ^ uVar24;
        uVar43 = ((uVar43 >> 7 ^ uVar43) & 0xaa00aa00aa00aa) * 0x81 ^ uVar43;
        uVar24 = ((uVar24 >> 0xe ^ uVar24) & 0xcccc0000cccc) * 0x4001 ^ uVar24;
        uVar43 = ((uVar43 >> 0xe ^ uVar43) & 0xcccc0000cccc) * 0x4001 ^ uVar43;
        uVar13 = (ulong)(((uint)(uVar24 >> 0x1c) ^ (uint)uVar24) & 0xf0f0f0f0);
        uVar24 = (uVar13 << 0x1c | uVar13) ^ uVar24;
        uVar13 = (ulong)(((uint)(uVar43 >> 0x1c) ^ (uint)uVar43) & 0xf0f0f0f0);
        uVar43 = (uVar13 << 0x1c | uVar13) ^ uVar43;
        uVar13 = (uVar24 >> 8 ^ uVar43) & 0xff00ff00ff00ff;
        uVar24 = uVar13 << 8 ^ uVar24;
        lVar16 = lVar16 + 0x10;
        bVar14 = (byte)lVar16;
        uVar13 = uVar13 ^ uVar43;
        uVar28 = uVar28 | (uVar24 & 0xffff) << (bVar14 & 0x3f);
        uVar34 = uVar34 | (uVar24 >> 0x10 & 0xffff) << (bVar14 & 0x3f);
        uVar22 = uVar22 | (uVar24 >> 0x20 & 0xffff) << (bVar14 & 0x3f);
        uVar27 = uVar27 | (uVar24 >> 0x30) << (bVar14 & 0x3f);
        uVar39 = uVar39 | (uVar13 & 0xffff) << (bVar14 & 0x3f);
        uVar36 = uVar36 | (uVar13 >> 0x10 & 0xffff) << (bVar14 & 0x3f);
        uVar41 = uVar41 | (uVar13 >> 0x20 & 0xffff) << (bVar14 & 0x3f);
        uVar26 = uVar26 | (uVar13 >> 0x30) << (bVar14 & 0x3f);
      } while (lVar16 != 0x30);
      uVar24 = (ulong)(uint)(*(int *)&local_78[-0xc].vt * 8);
      uVar28 = uVar28 ^ (ulong)local_78[uVar24 - 0xa2].vt;
      uVar39 = uVar39 ^ (ulong)local_78[uVar24 - 0xa1].vt;
      uVar36 = uVar36 ^ (ulong)local_78[uVar24 - 0x9f].vt;
      uVar22 = uVar22 ^ (ulong)local_78[uVar24 - 0x9e].vt;
      uVar41 = uVar41 ^ (ulong)local_78[uVar24 - 0x9d].vt;
      uVar27 = uVar27 ^ (ulong)local_78[uVar24 - 0x9c].vt;
      uVar26 = uVar26 ^ (ulong)local_78[uVar24 - 0x9b].vt;
      uVar47 = uVar27 ^ uVar22;
      uVar23 = uVar22 ^ uVar36;
      uVar29 = uVar28 ^ uVar23;
      uVar43 = uVar47 ^ uVar28 ^ uVar39;
      uVar17 = uVar43 ^ uVar23;
      uVar27 = uVar26 ^ uVar27;
      uVar35 = uVar34 ^ (ulong)local_78[uVar24 - 0xa0].vt ^ uVar17 ^ uVar26;
      uVar44 = uVar17 ^ uVar26 ^ uVar36;
      uVar18 = uVar26 ^ uVar47;
      uVar34 = uVar43 ^ uVar41;
      uVar31 = uVar34 ^ uVar29;
      uVar45 = uVar27 ^ uVar36 ^ uVar28;
      uVar32 = uVar35 ^ uVar23 ^ uVar34;
      uVar37 = uVar32 ^ uVar18;
      uVar19 = (uVar35 ^ uVar23) & uVar23;
      uVar33 = (uVar37 ^ uVar31) & (uVar27 ^ uVar23) ^ uVar19;
      uVar19 = uVar45 & uVar27 ^ uVar19;
      uVar13 = uVar37 & uVar44;
      uVar25 = uVar32 & uVar43 ^ uVar36 ^ uVar28 ^ uVar19 ^ uVar13;
      uVar39 = uVar39 ^ uVar29;
      uVar36 = uVar31 & uVar39;
      uVar13 = (uVar26 ^ uVar22) & uVar18 ^ uVar35 ^ uVar13 ^ uVar33;
      uVar33 = uVar47 & uVar29 ^ uVar41 ^ uVar47 ^ uVar28 ^ uVar36 ^ uVar33;
      uVar19 = uVar17 & uVar34 ^ uVar41 ^ uVar36 ^ uVar23 ^ uVar19;
      uVar41 = uVar13 ^ uVar25;
      uVar13 = uVar13 & uVar33;
      uVar42 = (uVar13 ^ uVar19) & uVar41 ^ uVar25;
      uVar28 = (uVar25 ^ uVar13) & (uVar33 ^ uVar19);
      uVar38 = uVar28 ^ uVar19;
      uVar28 = (uVar28 ^ uVar13) & uVar19;
      uVar33 = uVar33 ^ uVar28;
      uVar41 = (uVar28 ^ uVar13 ^ uVar19) & uVar42 ^ uVar41;
      uVar28 = uVar33 ^ uVar38;
      uVar19 = uVar41 ^ uVar28;
      uVar22 = uVar28 & (uVar26 ^ uVar22);
      uVar26 = uVar42 ^ uVar38;
      uVar46 = uVar31 & (uVar41 ^ uVar42);
      uVar39 = (uVar41 ^ uVar42) & uVar39;
      uVar34 = uVar34 & uVar42;
      uVar40 = (uVar19 ^ uVar26) & (uVar27 ^ uVar23);
      uVar45 = uVar45 & uVar19;
      uVar25 = uVar41 & uVar47 ^ uVar45 ^ uVar26 & uVar35 ^ uVar39 ^ uVar40;
      uVar13 = uVar32 & uVar38 ^ uVar38 & uVar43;
      uVar35 = uVar25 ^ uVar46;
      uVar36 = uVar35 ^ uVar29 & uVar41;
      uVar25 = uVar25 ^ uVar37 & uVar33;
      uVar43 = uVar38 & uVar43 ^ uVar33 & uVar44 ^ uVar19 & uVar27;
      uVar35 = uVar35 ^ uVar34;
      uVar42 = uVar42 & uVar17 ^ uVar13 ^ uVar18 & uVar28 ^ uVar22 ^ uVar36;
      uVar36 = uVar45 ^ (uVar37 ^ uVar31) & (uVar19 ^ uVar26) ^ uVar36;
      uVar17 = uVar43 ^ uVar23 & uVar26;
      uVar26 = uVar41 & uVar47 ^ uVar42;
      uVar42 = uVar39 ^ uVar40 ^ uVar43 ^ uVar42;
      uVar39 = uVar32 & uVar38 ^ uVar25;
      uVar25 = uVar18 & uVar28 ^ uVar34 ^ uVar29 & uVar41 ^ uVar25;
      uVar22 = uVar13 ^ uVar34 ^ uVar37 & uVar33 ^ uVar22 ^ uVar19 & uVar27 ^ uVar46 ^ uVar40 ^
               uVar36;
      auVar48._8_8_ = uVar17;
      auVar48._0_8_ = uVar36;
      auVar54._8_8_ = uVar25;
      auVar54._0_8_ = uVar22;
      auVar69._8_8_ = uVar39;
      auVar69._0_8_ = uVar26;
      auVar62._8_8_ = uVar42;
      auVar62._0_8_ = uVar35;
      auVar103._0_8_ = uVar35 >> 8;
      auVar103._8_8_ = uVar42 >> 8;
      auVar60._0_8_ = uVar26 >> 8;
      auVar60._8_8_ = uVar39 >> 8;
      auVar67._0_8_ = uVar22 >> 8;
      auVar67._8_8_ = uVar25 >> 8;
      auVar53._0_8_ = uVar36 >> 8;
      auVar53._8_8_ = uVar17 >> 8;
      auVar104 = (auVar103 ^ auVar62) & _DAT_00182610;
      auVar60 = (auVar60 ^ auVar69) & _DAT_00182610;
      auVar67 = (auVar67 ^ auVar54) & _DAT_00182610;
      auVar53 = (auVar53 ^ auVar48) & _DAT_00182610;
      auVar49._0_8_ = auVar53._0_8_ << 8;
      auVar49._8_8_ = auVar53._8_8_ << 8;
      auVar70._0_8_ = auVar67._0_8_ << 8;
      auVar70._8_8_ = auVar67._8_8_ << 8;
      auVar68._0_8_ = auVar60._0_8_ << 8;
      auVar68._8_8_ = auVar60._8_8_ << 8;
      auVar61._0_8_ = auVar104._0_8_ << 8;
      auVar61._8_8_ = auVar104._8_8_ << 8;
      auVar62 = (auVar61 | auVar104) ^ auVar62;
      auVar69 = (auVar68 | auVar60) ^ auVar69;
      auVar54 = (auVar70 | auVar67) ^ auVar54;
      auVar48 = (auVar49 | auVar53) ^ auVar48;
      auVar99._0_8_ = auVar48._0_8_ >> 0xc;
      auVar99._8_8_ = auVar48._8_8_ >> 0xc;
      auVar97._0_8_ = auVar54._0_8_ >> 0xc;
      auVar97._8_8_ = auVar54._8_8_ >> 0xc;
      auVar83._0_8_ = auVar69._0_8_ >> 0xc;
      auVar83._8_8_ = auVar69._8_8_ >> 0xc;
      auVar104._0_8_ = auVar62._0_8_ >> 0xc;
      auVar104._8_8_ = auVar62._8_8_ >> 0xc;
      auVar105._0_8_ = auVar62._0_8_ << 4;
      auVar105._8_8_ = auVar62._8_8_ << 4;
      auVar120._0_8_ = auVar69._0_8_ << 4;
      auVar120._8_8_ = auVar69._8_8_ << 4;
      auVar125._0_8_ = auVar54._0_8_ << 4;
      auVar125._8_8_ = auVar54._8_8_ << 4;
      auVar133._0_8_ = auVar48._0_8_ << 4;
      auVar133._8_8_ = auVar48._8_8_ << 4;
      auVar49 = auVar48 & _DAT_00182640 | auVar133 & _DAT_00182630 | auVar99 & _DAT_00182620;
      auVar48 = auVar54 & _DAT_00182640 | auVar125 & _DAT_00182630 | auVar97 & _DAT_00182620;
      auVar70 = auVar69 & _DAT_00182640 | auVar120 & _DAT_00182630 | auVar83 & _DAT_00182620;
      auVar53 = auVar62 & _DAT_00182640 | auVar105 & _DAT_00182630 | auVar104 & _DAT_00182620;
      psVar30 = local_68 + (uVar24 - 8);
      iVar15 = *(int *)&local_78[-0xc].vt + -1;
      if (iVar15 == 0) {
        psVar20 = local_68 + uVar24;
      }
      else {
        do {
          psVar20 = psVar30;
          uVar22 = auVar48._8_8_ ^ (ulong)psVar20[2].vt;
          auVar54 = *(undefined1 (*) [16])(psVar20 + 4);
          auVar98._0_8_ = auVar54._8_8_;
          auVar98._8_4_ = auVar54._0_4_;
          auVar98._12_4_ = auVar54._4_4_;
          auVar98 = auVar98 ^ auVar70;
          auVar84._0_8_ = auVar53._8_8_;
          auVar84._8_4_ = auVar53._0_4_;
          auVar84._12_4_ = auVar53._4_4_;
          auVar63._0_8_ = auVar98._8_8_;
          auVar63._8_4_ = auVar98._0_4_;
          auVar63._12_4_ = auVar98._4_4_;
          auVar84 = auVar84 ^ *(undefined1 (*) [16])(psVar20 + 6);
          uVar27 = auVar84._0_8_;
          uVar34 = auVar98._0_8_;
          uVar36 = auVar84._8_8_;
          uVar82 = auVar84._0_4_;
          uVar96 = auVar84._4_4_;
          auVar146._8_4_ = uVar82;
          auVar146._0_8_ = uVar27;
          auVar146._12_4_ = uVar96;
          uVar26 = auVar63._8_8_;
          auVar106._0_8_ = auVar63._0_8_ << 2;
          auVar106._8_8_ = uVar26 << 2;
          auVar126._0_8_ = auVar63._0_8_ >> 2;
          auVar126._8_8_ = uVar26 >> 2;
          auVar50._0_8_ = auVar48._0_8_ ^ (ulong)psVar20[3].vt;
          auVar50._8_8_ = auVar49._8_8_ ^ (ulong)psVar20->vt;
          auVar55._8_4_ = auVar84._8_4_;
          auVar55._0_8_ = uVar36;
          auVar55._12_4_ = auVar84._12_4_;
          auVar121._0_8_ = uVar22 ^ uVar36;
          auVar121._8_8_ = auVar50._8_8_ ^ auVar55._8_8_;
          uVar39 = auVar49._0_8_ ^ (ulong)psVar20[1].vt;
          auVar49 = (~_DAT_00182650 & auVar126 | auVar106 & _DAT_00182650) ^ auVar63;
          uVar28 = uVar27 ^ uVar39;
          auVar143._8_4_ = uVar82;
          auVar143._0_8_ = uVar34;
          auVar143._12_4_ = uVar96;
          auVar107._8_4_ = uVar82;
          auVar107._0_8_ = uVar34;
          auVar107._12_4_ = uVar96;
          auVar108._0_8_ = uVar34 >> 1;
          auVar108._8_8_ = auVar107._8_8_ >> 1;
          uVar41 = auVar49._0_8_;
          uVar24 = auVar49._8_8_;
          auVar134._0_8_ = uVar41 >> 1;
          auVar134._8_8_ = uVar24 >> 1;
          uVar43 = auVar146._8_8_;
          auVar109._0_8_ = auVar50._0_8_ ^ uVar34 ^ uVar28 ^ auVar121._8_8_;
          auVar109._8_8_ = uVar43 ^ uVar26;
          auVar127._8_4_ = uVar82;
          auVar127._0_8_ = uVar34;
          auVar127._12_4_ = uVar96;
          auVar128._0_8_ = uVar34 << 3;
          auVar128._8_8_ = auVar127._8_8_ << 3;
          auVar140._0_8_ = uVar41 << 3;
          auVar140._8_8_ = uVar24 << 3;
          auVar100._8_8_ = uVar36;
          auVar100._0_8_ = auVar121._0_8_;
          auVar143 = (~_DAT_00182660 & auVar108 | auVar128 & _DAT_00182660) ^ auVar143;
          uVar41 = auVar143._0_8_;
          uVar24 = auVar143._8_8_;
          auVar144._0_8_ = uVar41 >> 2;
          auVar144._8_8_ = uVar24 >> 2;
          auVar147._0_8_ = uVar41 << 2;
          auVar147._8_8_ = uVar24 << 2;
          auVar48 = auVar109 ^ auVar121;
          uVar27 = auVar121._0_8_ ^ uVar27;
          auVar56._0_8_ = auVar50._0_8_ ^ uVar36;
          auVar56._8_8_ = auVar63._0_8_ ^ uVar26;
          auVar85._0_8_ = auVar121._0_8_ >> 1;
          auVar85._8_8_ = uVar36 >> 1;
          auVar86._0_8_ = auVar121._0_8_ << 3;
          auVar86._8_8_ = uVar36 << 3;
          auVar100 = (~_DAT_00182660 & auVar85 | auVar86 & _DAT_00182660) ^ auVar100;
          uVar26 = auVar56._8_8_ ^ auVar56._0_8_ ^ uVar27;
          auVar141._0_8_ = auVar109._8_8_ ^ auVar63._0_8_;
          auVar141._8_8_ = uVar43 ^ uVar36;
          auVar54 = auVar141 ^ auVar56;
          auVar91._8_8_ = uVar26;
          auVar91._0_8_ = auVar63._0_8_;
          auVar76._0_8_ = auVar54._0_8_ << 3;
          auVar76._8_8_ = auVar54._8_8_ << 3;
          auVar87._0_8_ = auVar54._0_8_ >> 1;
          auVar87._8_8_ = auVar54._8_8_ >> 1;
          uVar41 = auVar121._8_8_ ^ uVar39 ^ auVar141._8_8_;
          uVar36 = auVar109._8_8_ ^ uVar41;
          uVar41 = uVar41 ^ uVar22;
          auVar77._8_8_ = uVar41;
          auVar77._0_8_ = uVar39;
          auVar54 = (~_DAT_00182660 & auVar87 | auVar76 & _DAT_00182660) ^ auVar54;
          auVar88._0_8_ = uVar39 >> 1;
          auVar88._8_8_ = uVar41 >> 1;
          auVar89._0_8_ = auVar48._0_8_ >> 1;
          auVar89._8_8_ = auVar48._8_8_ >> 1;
          auVar148._0_8_ = auVar63._0_8_ << 3;
          auVar148._8_8_ = uVar26 << 3;
          auVar90._0_8_ = auVar48._0_8_ << 3;
          auVar90._8_8_ = auVar48._8_8_ << 3;
          auVar122._0_8_ = auVar63._0_8_ >> 1;
          auVar122._8_8_ = uVar26 >> 1;
          auVar123._0_8_ = uVar39 << 3;
          auVar123._8_8_ = uVar41 << 3;
          auVar48 = (~_DAT_00182660 & auVar89 | auVar90 & _DAT_00182660) ^ auVar48;
          auVar110._0_8_ = auVar48._0_8_ >> 2;
          auVar110._8_8_ = auVar48._8_8_ >> 2;
          uVar41 = auVar100._0_8_;
          uVar24 = auVar100._8_8_;
          auVar101._0_8_ = uVar41 >> 2;
          auVar101._8_8_ = uVar24 >> 2;
          auVar111._0_8_ = uVar41 << 2;
          auVar111._8_8_ = uVar24 << 2;
          auVar77 = (~_DAT_00182660 & auVar88 | auVar123 & _DAT_00182660) ^ auVar77;
          auVar112._8_8_ = uVar43;
          auVar112._0_8_ = uVar28;
          auVar71._0_8_ = uVar28 >> 2;
          auVar71._8_8_ = uVar43 >> 2;
          auVar72._0_8_ = uVar28 * 4;
          auVar72._8_8_ = uVar43 * 4;
          auVar145._0_8_ = auVar54._0_8_ >> 2;
          auVar145._8_8_ = auVar54._8_8_ >> 2;
          auVar91 = (~_DAT_00182660 & auVar122 | auVar148 & _DAT_00182660) ^ auVar91;
          auVar112 = (~_DAT_00182650 & auVar71 | auVar72 & _DAT_00182650) ^ auVar112;
          uVar41 = auVar112._0_8_;
          uVar24 = auVar112._8_8_;
          auVar113._0_8_ = uVar41 >> 1;
          auVar113._8_8_ = uVar24 >> 1;
          auVar102._0_8_ = uVar41 << 3;
          auVar102._8_8_ = uVar24 << 3;
          uVar28 = uVar28 ^ uVar26;
          auVar129._0_8_ = auVar54._0_8_ << 2;
          auVar129._8_8_ = auVar54._8_8_ << 2;
          uVar24 = auVar77._0_8_;
          uVar13 = auVar77._8_8_;
          auVar130._0_8_ = uVar24 >> 2;
          auVar130._8_8_ = uVar13 >> 2;
          auVar135._0_8_ = auVar48._0_8_ << 2;
          auVar135._8_8_ = auVar48._8_8_ << 2;
          uVar26 = auVar91._0_8_;
          uVar41 = auVar91._8_8_;
          auVar114._0_8_ = uVar26 >> 2;
          auVar114._8_8_ = uVar41 >> 2;
          auVar131._8_8_ = uVar36;
          auVar131._0_8_ = auVar121._8_8_;
          auVar142._0_8_ = auVar121._8_8_ >> 1;
          auVar142._8_8_ = uVar36 >> 1;
          auVar136._0_8_ = auVar121._8_8_ << 3;
          auVar136._8_8_ = uVar36 << 3;
          auVar115._0_8_ = uVar24 << 2;
          auVar115._8_8_ = uVar13 << 2;
          auVar131 = (~_DAT_00182660 & auVar142 | auVar136 & _DAT_00182660) ^ auVar131;
          auVar49 = ~_DAT_00182650 & auVar130 | auVar115 & _DAT_00182650;
          uVar36 = auVar131._0_8_;
          uVar24 = auVar131._8_8_;
          auVar116._0_8_ = uVar36 >> 2;
          auVar116._8_8_ = uVar24 >> 2;
          auVar137._0_8_ = uVar26 << 2;
          auVar137._8_8_ = uVar41 << 2;
          auVar117._0_8_ = uVar36 << 2;
          auVar117._8_8_ = uVar24 << 2;
          auVar60 = ~_DAT_00182650 & auVar116 | auVar117 & _DAT_00182650;
          auVar70 = ~_DAT_00182650 & auVar114 | auVar137 & _DAT_00182650;
          auVar118._8_8_ = uVar28;
          auVar118._0_8_ = auVar56._0_8_;
          auVar138._0_8_ = auVar56._0_8_ >> 1;
          auVar138._8_8_ = uVar28 >> 1;
          auVar139._0_8_ = auVar56._0_8_ << 3;
          auVar139._8_8_ = uVar28 << 3;
          auVar118 = (~_DAT_00182660 & auVar138 | auVar139 & _DAT_00182660) ^ auVar118;
          uVar26 = auVar118._0_8_;
          uVar43 = auVar118._8_8_;
          auVar132._0_8_ = uVar26 >> 2;
          auVar132._8_8_ = uVar43 >> 2;
          auVar53 = (~_DAT_00182660 & auVar113 | auVar102 & _DAT_00182660) ^
                    (~_DAT_00182650 & auVar101 | auVar111 & _DAT_00182650) ^ auVar50 ^ auVar48 ^
                    (~_DAT_00182650 & auVar110 | auVar135 & _DAT_00182650);
          auVar124._0_8_ = uVar26 << 2;
          auVar124._8_8_ = uVar43 << 2;
          auVar48 = ~_DAT_00182650 & auVar132 | auVar124 & _DAT_00182650;
          uVar36 = (auVar121._8_8_ >> 2 & 0x3333333333333333 |
                   auVar121._8_8_ * 4 & 0xcccccccccccccccc) ^ auVar121._8_8_;
          uVar28 = (auVar141._8_8_ >> 2 & 0x3333333333333333 |
                   auVar141._8_8_ * 4 & 0xcccccccccccccccc) ^ auVar141._8_8_;
          uVar27 = (uVar27 >> 2 & 0x3333333333333333 | uVar27 * 4 & 0xcccccccccccccccc) ^ uVar27;
          uVar26 = (auVar56._0_8_ >> 2 & 0x3333333333333333 | auVar56._0_8_ * 4 & 0xcccccccccccccccc
                   ) ^ auVar56._0_8_;
          uVar28 = uVar24 ^ uVar39 ^
                   auVar60._8_8_ ^
                   auVar60._0_8_ ^
                   (uVar28 >> 1 & 0x7777777777777777 | uVar28 * 8 & 0x8888888888888888);
          uVar18 = uVar41 ^ uVar34 ^
                   auVar70._8_8_ ^
                   auVar70._0_8_ ^
                   (uVar26 >> 1 & 0x7777777777777777 | uVar26 * 8 & 0x8888888888888888);
          auVar70 = (~_DAT_00182650 & auVar144 | auVar147 & _DAT_00182650) ^
                    (~_DAT_00182660 & auVar134 | auVar140 & _DAT_00182660) ^ auVar84 ^ auVar54 ^
                    (~_DAT_00182650 & auVar145 | auVar129 & _DAT_00182650);
          uVar39 = uVar43 ^ auVar63._0_8_ ^
                   auVar48._8_8_ ^
                   auVar48._0_8_ ^
                   (uVar27 >> 1 & 0x7777777777777777 | uVar27 * 8 & 0x8888888888888888);
          uVar26 = auVar70._0_8_;
          uVar41 = auVar53._0_8_;
          uVar24 = uVar39 ^ uVar26;
          uVar19 = auVar53._8_8_;
          uVar43 = uVar39 ^ uVar41;
          uVar32 = uVar24 ^ uVar19 ^ uVar28;
          uVar29 = auVar70._8_8_;
          uVar38 = uVar32 ^ uVar43;
          uVar23 = uVar13 ^ uVar22 ^
                   auVar49._8_8_ ^
                   auVar49._0_8_ ^
                   (uVar36 >> 1 & 0x7777777777777777 | uVar36 * 8 & 0x8888888888888888) ^
                   uVar38 ^ uVar29;
          uVar40 = uVar38 ^ uVar29 ^ uVar41;
          uVar31 = uVar24 ^ uVar29;
          uVar26 = uVar26 ^ uVar29;
          uVar33 = uVar19 ^ uVar43;
          uVar27 = uVar32 ^ uVar18;
          uVar22 = uVar27 ^ uVar33;
          uVar25 = uVar23 ^ uVar43 ^ uVar27;
          local_40 = uVar25 ^ uVar31;
          uVar42 = uVar41 ^ uVar19 ^ uVar26;
          local_38 = local_40 ^ uVar22;
          uVar36 = (uVar23 ^ uVar43) & uVar43;
          uVar17 = local_38 & (uVar43 ^ uVar26) ^ uVar36;
          uVar36 = uVar42 & uVar26 ^ uVar36;
          uVar34 = local_40 & uVar40;
          uVar13 = uVar25 & uVar32 ^ uVar41 ^ uVar19 ^ uVar36 ^ uVar34;
          uVar28 = uVar28 ^ uVar33;
          uVar41 = uVar22 & uVar28;
          uVar34 = uVar31 & (uVar39 ^ uVar29) ^ uVar23 ^ uVar34 ^ uVar17;
          uVar17 = uVar33 & uVar24 ^ uVar18 ^ uVar24 ^ uVar19 ^ uVar41 ^ uVar17;
          uVar36 = uVar38 & uVar27 ^ uVar18 ^ uVar41 ^ uVar43 ^ uVar36;
          uVar18 = uVar34 & uVar17;
          uVar34 = uVar34 ^ uVar13;
          uVar41 = (uVar18 ^ uVar36) & uVar34 ^ uVar13;
          uVar19 = (uVar13 ^ uVar18) & (uVar17 ^ uVar36);
          uVar13 = uVar19 ^ uVar36;
          uVar19 = (uVar19 ^ uVar18) & uVar36;
          uVar17 = uVar17 ^ uVar19;
          local_40 = local_40 & uVar17;
          uVar34 = (uVar19 ^ uVar18 ^ uVar36) & uVar41 ^ uVar34;
          uVar18 = uVar17 ^ uVar13;
          uVar35 = uVar34 ^ uVar18;
          uVar19 = uVar18 & (uVar39 ^ uVar29);
          uVar36 = uVar41 ^ uVar13;
          uVar22 = uVar22 & (uVar34 ^ uVar41);
          uVar28 = (uVar34 ^ uVar41) & uVar28;
          uVar27 = uVar27 & uVar41;
          uVar29 = (uVar35 ^ uVar36) & (uVar43 ^ uVar26);
          uVar42 = uVar42 & uVar35;
          uVar37 = uVar25 & uVar13 ^ uVar13 & uVar32;
          uVar39 = uVar34 & uVar24 ^ uVar42 ^ uVar36 & uVar23 ^ uVar28 ^ uVar29;
          uVar17 = uVar13 & uVar32 ^ uVar17 & uVar40 ^ uVar35 & uVar26;
          uVar32 = uVar39 ^ uVar22;
          uVar39 = uVar39 ^ local_40;
          uVar23 = uVar32 ^ uVar33 & uVar34;
          uVar32 = uVar32 ^ uVar27;
          uVar41 = uVar41 & uVar38 ^ uVar37 ^ uVar31 & uVar18 ^ uVar19 ^ uVar23;
          uVar23 = uVar42 ^ local_38 & (uVar35 ^ uVar36) ^ uVar23;
          uVar36 = uVar17 ^ uVar43 & uVar36;
          uVar24 = uVar34 & uVar24 ^ uVar41;
          uVar41 = uVar28 ^ uVar29 ^ uVar17 ^ uVar41;
          uVar28 = uVar25 & uVar13 ^ uVar39;
          uVar39 = uVar31 & uVar18 ^ uVar27 ^ uVar33 & uVar34 ^ uVar39;
          uVar22 = uVar37 ^ uVar27 ^ local_40 ^ uVar19 ^ uVar35 & uVar26 ^ uVar22 ^ uVar29 ^ uVar23;
          auVar52._8_8_ = uVar36;
          auVar52._0_8_ = uVar23;
          auVar59._8_8_ = uVar39;
          auVar59._0_8_ = uVar22;
          auVar75._8_8_ = uVar28;
          auVar75._0_8_ = uVar24;
          auVar66._8_8_ = uVar41;
          auVar66._0_8_ = uVar32;
          auVar119._0_8_ = uVar32 >> 8;
          auVar119._8_8_ = uVar41 >> 8;
          auVar64._0_8_ = uVar24 >> 8;
          auVar64._8_8_ = uVar28 >> 8;
          auVar73._0_8_ = uVar22 >> 8;
          auVar73._8_8_ = uVar39 >> 8;
          auVar57._0_8_ = uVar23 >> 8;
          auVar57._8_8_ = uVar36 >> 8;
          auVar70 = (auVar119 ^ auVar66) & _DAT_00182610;
          auVar48 = (auVar64 ^ auVar75) & _DAT_00182610;
          auVar53 = (auVar73 ^ auVar59) & _DAT_00182610;
          auVar49 = (auVar57 ^ auVar52) & _DAT_00182610;
          auVar51._0_8_ = auVar49._0_8_ << 8;
          auVar51._8_8_ = auVar49._8_8_ << 8;
          auVar58._0_8_ = auVar53._0_8_ << 8;
          auVar58._8_8_ = auVar53._8_8_ << 8;
          auVar74._0_8_ = auVar48._0_8_ << 8;
          auVar74._8_8_ = auVar48._8_8_ << 8;
          auVar65._0_8_ = auVar70._0_8_ << 8;
          auVar65._8_8_ = auVar70._8_8_ << 8;
          auVar66 = (auVar65 | auVar70) ^ auVar66;
          auVar75 = (auVar74 | auVar48) ^ auVar75;
          auVar59 = (auVar58 | auVar53) ^ auVar59;
          auVar52 = (auVar51 | auVar49) ^ auVar52;
          auVar78._0_8_ = auVar52._0_8_ >> 0xc;
          auVar78._8_8_ = auVar52._8_8_ >> 0xc;
          auVar92._0_8_ = auVar52._0_8_ << 4;
          auVar92._8_8_ = auVar52._8_8_ << 4;
          auVar93._0_8_ = auVar59._0_8_ >> 0xc;
          auVar93._8_8_ = auVar59._8_8_ >> 0xc;
          auVar49 = auVar52 & _DAT_00182640 | auVar92 & _DAT_00182630 | auVar78 & _DAT_00182620;
          auVar79._0_8_ = auVar59._0_8_ << 4;
          auVar79._8_8_ = auVar59._8_8_ << 4;
          auVar48 = auVar59 & _DAT_00182640 | auVar79 & _DAT_00182630 | auVar93 & _DAT_00182620;
          auVar94._0_8_ = auVar75._0_8_ << 4;
          auVar94._8_8_ = auVar75._8_8_ << 4;
          auVar80._0_8_ = auVar75._0_8_ >> 0xc;
          auVar80._8_8_ = auVar75._8_8_ >> 0xc;
          auVar70 = auVar75 & _DAT_00182640 | auVar94 & _DAT_00182630 | auVar80 & _DAT_00182620;
          auVar81._0_8_ = auVar66._0_8_ << 4;
          auVar81._8_8_ = auVar66._8_8_ << 4;
          auVar95._0_8_ = auVar66._0_8_ >> 0xc;
          auVar95._8_8_ = auVar66._8_8_ >> 0xc;
          auVar53 = auVar66 & _DAT_00182640 | auVar81 & _DAT_00182630 | auVar95 & _DAT_00182620;
          psVar30 = psVar20 + -8;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
      psVar1 = psVar30->vt;
      psVar2 = psVar20[-7].vt;
      psVar3 = psVar20[-6].vt;
      psVar4 = psVar20[-5].vt;
      psVar5 = psVar20[-4].vt;
      psVar6 = psVar20[-3].vt;
      psVar7 = psVar20[-2].vt;
      psVar8 = psVar20[-1].vt;
      lVar16 = 0;
      do {
        bVar14 = (byte)lVar16;
        uVar26 = (auVar49._0_8_ ^ (ulong)psVar2) >> (bVar14 & 0x3f) & 0xffff |
                 (ulong)(uint)((int)((auVar48._0_8_ ^ (ulong)psVar4) >> (bVar14 & 0x3f)) << 0x10) |
                 ((auVar70._0_8_ ^ (ulong)psVar6) >> (bVar14 & 0x3f) & 0xffff) << 0x20 |
                 ((auVar53._0_8_ ^ (ulong)psVar8) >> (bVar14 & 0x3f)) << 0x30;
        uVar27 = (auVar49._8_8_ ^ (ulong)psVar1) >> (bVar14 & 0x3f) & 0xffff |
                 (ulong)(uint)((int)((auVar48._8_8_ ^ (ulong)psVar3) >> (bVar14 & 0x3f)) << 0x10) |
                 ((auVar70._8_8_ ^ (ulong)psVar5) >> (bVar14 & 0x3f) & 0xffff) << 0x20 |
                 ((auVar53._8_8_ ^ (ulong)psVar7) >> (bVar14 & 0x3f)) << 0x30;
        uVar22 = (uVar27 >> 8 ^ uVar26) & 0xff00ff00ff00ff;
        uVar27 = uVar22 << 8 ^ uVar27;
        uVar22 = uVar22 ^ uVar26;
        uVar26 = (ulong)(((uint)(uVar27 >> 0x1c) ^ (uint)uVar27) & 0xf0f0f0f0);
        uVar27 = (uVar26 << 0x1c | uVar26) ^ uVar27;
        uVar26 = (ulong)(((uint)(uVar22 >> 0x1c) ^ (uint)uVar22) & 0xf0f0f0f0);
        uVar22 = (uVar26 << 0x1c | uVar26) ^ uVar22;
        uVar27 = ((uVar27 >> 0xe ^ uVar27) & 0xcccc0000cccc) * 0x4001 ^ uVar27;
        uVar22 = ((uVar22 >> 0xe ^ uVar22) & 0xcccc0000cccc) * 0x4001 ^ uVar22;
        uVar27 = ((uVar27 >> 7 ^ uVar27) & 0xaa00aa00aa00aa) * 0x81 ^ uVar27;
        uVar22 = ((uVar22 >> 7 ^ uVar22) & 0xaa00aa00aa00aa) * 0x81 ^ uVar22;
        local_b8[lVar16] = (char)uVar27;
        local_b8[lVar16 + 1] = (char)(uVar27 >> 8);
        local_b8[lVar16 + 2] = (char)(uVar27 >> 0x10);
        local_b8[lVar16 + 3] = (char)(uVar27 >> 0x18);
        local_b8[lVar16 + 4] = (char)(uVar27 >> 0x20);
        local_b8[lVar16 + 5] = (char)(uVar27 >> 0x28);
        local_b8[lVar16 + 6] = (char)(uVar27 >> 0x30);
        local_b8[lVar16 + 7] = (char)(uVar27 >> 0x38);
        local_b8[lVar16 + 8] = (char)uVar22;
        local_b8[lVar16 + 9] = (char)(uVar22 >> 8);
        local_b8[lVar16 + 10] = (char)(uVar22 >> 0x10);
        local_b8[lVar16 + 0xb] = (char)(uVar22 >> 0x18);
        local_b8[lVar16 + 0xc] = (char)(uVar22 >> 0x20);
        local_b8[lVar16 + 0xd] = (char)(uVar22 >> 0x28);
        local_b8[lVar16 + 0xe] = (char)(uVar22 >> 0x30);
        local_b8[lVar16 + 0xf] = (char)(uVar22 >> 0x38);
        psVar20 = local_70;
        psVar30 = local_78;
        lVar16 = lVar16 + 0x10;
      } while (lVar16 != 0x40);
      lVar16 = local_58 + (local_58 == 0);
      lVar21 = 0;
      do {
        *(ulong *)(local_b8 + lVar21) = *(ulong *)(local_b8 + lVar21) ^ (ulong)psVar30[-0xb].vt;
        *(ulong *)(local_b8 + lVar21 + 8) =
             *(ulong *)(local_b8 + lVar21 + 8) ^ (ulong)psVar30[-10].vt;
        psVar1 = (ssh_cipheralg *)((undefined8 *)((long)pvVar10 + lVar21))[1];
        psVar20->vt = *(ssh_cipheralg **)((long)pvVar10 + lVar21);
        psVar20[1].vt = psVar1;
        uVar9 = *(undefined8 *)(local_b8 + lVar21 + 8);
        *(undefined8 *)((long)pvVar10 + lVar21) = *(undefined8 *)(local_b8 + lVar21);
        ((undefined8 *)((long)pvVar10 + lVar21))[1] = uVar9;
        lVar21 = lVar21 + 0x10;
      } while (lVar16 * 0x10 != lVar21);
      vblk = (void *)((long)pvVar10 + local_60);
      uVar12 = local_50 - uVar12;
    } while (uVar12 != 0);
  }
  smemclr(local_b8,0x40);
  return;
}

Assistant:

static inline void aes_cbc_sw_decrypt(
    ssh_cipher *ciph, void *vblk, int blklen)
{
    aes_sw_context *ctx = container_of(ciph, aes_sw_context, ciph);
    uint8_t *blk = (uint8_t *)vblk;

    /*
     * CBC decryption can run in parallel, because all the
     * _ciphertext_ blocks are already available.
     */

    size_t blocks_remaining = blklen / 16;

    uint8_t data[SLICE_PARALLELISM * 16];
    /* Zeroing the data array is probably overcautious, but it avoids
     * technically undefined behaviour from leaving it uninitialised
     * if our very first iteration doesn't include enough cipher
     * blocks to populate it fully */
    memset(data, 0, sizeof(data));

    while (blocks_remaining > 0) {
        /* Number of blocks we'll handle in this iteration. If we're
         * dealing with fewer than the maximum, it doesn't matter -
         * it's harmless to run the full parallel cipher function
         * anyway. */
        size_t blocks = (blocks_remaining < SLICE_PARALLELISM ?
                         blocks_remaining : SLICE_PARALLELISM);

        /* Parallel-decrypt the input, in a separate array so we still
         * have the cipher stream available for XORing. */
        memcpy(data, blk, 16 * blocks);
        aes_sliced_d_parallel(data, data, &ctx->sk);

        /* Write the output and update the IV */
        for (size_t i = 0; i < blocks; i++) {
            uint8_t *decrypted = data + 16*i;
            uint8_t *output = blk + 16*i;

            memxor16(decrypted, decrypted, ctx->iv.cbc.prevblk);
            memcpy(ctx->iv.cbc.prevblk, output, 16);
            memcpy(output, decrypted, 16);
        }

        /* Advance the input pointer. */
        blk += 16 * blocks;
        blocks_remaining -= blocks;
    }

    smemclr(data, sizeof(data));
}